

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::lexer::token_type_name(string *__return_storage_ptr__,token_type t)

{
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  token_type local_14;
  string *psStack_10;
  token_type t_local;
  
  local_14 = t;
  psStack_10 = __return_storage_ptr__;
  switch(t) {
  case uninitialized:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<uninitialized>",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case literal_true:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"true literal",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case literal_false:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"false literal",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case literal_null:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null literal",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case value_string:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"string literal",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"number literal",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case begin_array:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'[\'",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case begin_object:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'{\'",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case end_array:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\']\'",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case end_object:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'}\'",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case name_separator:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\':\'",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case value_separator:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\',\'",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case parse_error:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<parse error>",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case end_of_input:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"end of input",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"unknown token",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string token_type_name(const token_type t)
        {
            switch (t)
            {
                case token_type::uninitialized:
                    return "<uninitialized>";
                case token_type::literal_true:
                    return "true literal";
                case token_type::literal_false:
                    return "false literal";
                case token_type::literal_null:
                    return "null literal";
                case token_type::value_string:
                    return "string literal";
                case lexer::token_type::value_unsigned:
                case lexer::token_type::value_integer:
                case lexer::token_type::value_float:
                    return "number literal";
                case token_type::begin_array:
                    return "'['";
                case token_type::begin_object:
                    return "'{'";
                case token_type::end_array:
                    return "']'";
                case token_type::end_object:
                    return "'}'";
                case token_type::name_separator:
                    return "':'";
                case token_type::value_separator:
                    return "','";
                case token_type::parse_error:
                    return "<parse error>";
                case token_type::end_of_input:
                    return "end of input";
                default:
                {
                    // catch non-enum values
                    return "unknown token"; // LCOV_EXCL_LINE
                }
            }
        }